

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::MergeFromImpl<true>
          (internal *this,BoundedZCIS input,MessageLite *msg,TcParseTableBase *tc_table,
          ParseFlags parse_flags)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ushort *ptr;
  MessageLite *this_00;
  ParseContext ctx;
  ushort *local_a0;
  undefined1 local_98 [24];
  TcParseTableBase *in_stack_ffffffffffffff80;
  MessageLite *msg_00;
  
  this_00 = input._8_8_;
  msg_00 = (MessageLite *)0x0;
  local_a0 = (ushort *)
             EpsCopyInputStream::InitFrom
                       ((EpsCopyInputStream *)local_98,(ZeroCopyInputStream *)this,(int)input.zcis);
  do {
    bVar1 = EpsCopyInputStream::DoneWithCheck<false>
                      ((EpsCopyInputStream *)local_98,(char **)&local_a0,-0x80000000);
    if (bVar1) break;
    uVar2 = (uint)(byte)(msg->_internal_metadata_).ptr_ & (uint)*local_a0;
    if ((uVar2 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar3 = (ulong)(uVar2 & 0xfffffff8);
    local_a0 = (ushort *)
               (**(code **)((long)&msg[3]._internal_metadata_.ptr_ + uVar3 * 2))
                         (this_00,local_a0,(EpsCopyInputStream *)local_98,
                          (ulong)*local_a0 ^ *(ulong *)((long)&msg[4]._vptr_MessageLite + uVar3 * 2)
                          ,msg,0);
  } while (local_a0 != (ushort *)0x0);
  if (((msg->_internal_metadata_).ptr_ & 0x100) == 0) {
    ptr = local_a0;
    if (local_a0 == (ushort *)0x0) {
      TcParser::VerifyHasBitConsistency(msg_00,in_stack_ffffffffffffff80);
      ptr = local_a0;
    }
  }
  else {
    ptr = (ushort *)(*(code *)msg[2]._internal_metadata_.ptr_)(this_00,local_a0,local_98);
  }
  if (ptr == (ushort *)0x0) {
    bVar1 = false;
  }
  else {
    EpsCopyInputStream::BackUp((EpsCopyInputStream *)local_98,(char *)ptr);
    if (((ulong)tc_table & 2) == 0) {
      bVar1 = MessageLite::IsInitializedWithErrors(this_00);
    }
    else {
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool MergeFromImpl(BoundedZCIS input, MessageLite* msg,
                   const internal::TcParseTableBase* tc_table,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input.zcis, input.limit);
  ptr = internal::TcParser::ParseLoop(msg, ptr, &ctx, tc_table);
  if (ABSL_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (ABSL_PREDICT_TRUE(ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}